

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O1

bool TestEthernetV3(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile)

{
  long lVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  ulong in_RAX;
  ostream *poVar5;
  bool bVar6;
  uint i;
  long lVar7;
  uint16_t phyid2;
  uint16_t phyid1;
  undefined8 uStack_38;
  
  cVar3 = (char)logFile;
  uStack_38 = in_RAX;
  std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar3);
  std::ostream::put(cVar3);
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"=== Ethernet (RTL8211F) Test ===",0x20)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  bVar6 = true;
  lVar7 = 1;
  do {
    uStack_38 = uStack_38 & 0xffffffff;
    bVar4 = FpgaIO::ReadRTL8211F_Register
                      (&Board->super_FpgaIO,(uint)lVar7,1,2,(uint16_t *)((long)&uStack_38 + 6));
    if (!bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)logFile,"Failed to read PHY",0x12);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)logFile);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," PHYID1",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    bVar4 = FpgaIO::ReadRTL8211F_Register
                      (&Board->super_FpgaIO,(uint)lVar7,1,3,(uint16_t *)((long)&uStack_38 + 4));
    if (!bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)logFile,"Failed to read PHY",0x12);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)logFile);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," PHYID2",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"PHY",3);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)logFile);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," PHYID = ",9);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    if ((uStack_38._6_2_ == 0x1c) && (uStack_38._4_2_ == -0x36ea)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile," - PASS",7);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)logFile," - FAIL (should be 1c, c916)",0x1c);
      bVar6 = false;
    }
    lVar1 = *(long *)logFile;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(logFile + lVar2 + 0x18) = *(uint *)(logFile + lVar2 + 0x18) & 0xffffffb5 | 2;
    std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  return bVar6;
}

Assistant:

bool TestEthernetV3(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile)
{
    logFile << std::endl << "=== Ethernet (RTL8211F) Test ===" << std::endl;
    bool ret = true;
    for (unsigned int i = 1; i <= 2; i++) {
        unsigned int phyAddr = FpgaIO::PHY_RTL8211F;
        uint16_t phyid1 = 0, phyid2 = 0;
        if (!Board.ReadRTL8211F_Register(i, phyAddr, FpgaIO::RTL8211F_PHYID1, phyid1))
            logFile << "Failed to read PHY" << i << " PHYID1" << std::endl;
        if (!Board.ReadRTL8211F_Register(i, phyAddr, FpgaIO::RTL8211F_PHYID2, phyid2))
            logFile << "Failed to read PHY" << i << " PHYID2" << std::endl;
        logFile << "PHY" << i << " PHYID = " << std::hex
                << phyid1 << ", " << phyid2;
        if ((phyid1 == 0x001c) && (phyid2 == 0xc916)) {
            logFile << " - PASS" << std::dec << std::endl;
        }
        else {
            logFile << " - FAIL (should be 1c, c916)" << std::dec << std::endl;
            ret = false;
        }
    }
    return ret;
}